

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Copysign_f64(w3Interp *this)

{
  double *pdVar1;
  double dVar2;
  double local_30;
  double *z1;
  double z2;
  w3Interp *this_local;
  
  dVar2 = w3Stack::pop_f64(&this->super_w3Stack);
  pdVar1 = w3Stack::f64(&this->super_w3Stack);
  if (dVar2 < 0.0 == (*pdVar1 <= 0.0 && *pdVar1 != 0.0)) {
    local_30 = *pdVar1;
  }
  else {
    local_30 = -*pdVar1;
  }
  *pdVar1 = local_30;
  return;
}

Assistant:

INTERP (Copysign_f64)
{
    const double z2 = pop_f64 ();
    double& z1 = f64 ();
    z1 = ((z2 < 0) != (z1 < 0)) ? -z1 : z1;
}